

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

int function_addrs_compare(void *v1,void *v2)

{
  int iVar1;
  function_addrs *a2;
  function_addrs *a1;
  
  iVar1 = -1;
  if ((*v2 <= *v1) && (iVar1 = 1, *v1 <= *v2)) {
    if ((*(ulong *)((long)v2 + 8) <= *(ulong *)((long)v1 + 8)) &&
       (iVar1 = -1, *(ulong *)((long)v1 + 8) <= *(ulong *)((long)v2 + 8))) {
      iVar1 = strcmp((char *)**(undefined8 **)((long)v1 + 0x10),
                     (char *)**(undefined8 **)((long)v2 + 0x10));
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int
function_addrs_compare (const void *v1, const void *v2)
{
  const struct function_addrs *a1 = (const struct function_addrs *) v1;
  const struct function_addrs *a2 = (const struct function_addrs *) v2;

  if (a1->low < a2->low)
    return -1;
  if (a1->low > a2->low)
    return 1;
  if (a1->high < a2->high)
    return 1;
  if (a1->high > a2->high)
    return -1;
  return strcmp (a1->function->name, a2->function->name);
}